

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O0

void __thiscall miniros::Subscription::getInfo(Subscription *this,XmlRpcValue *info)

{
  bool bVar1;
  element_type *peVar2;
  XmlRpcValue *this_00;
  string *this_01;
  XmlRpcValue *rhs;
  XmlRpcValue *in_RSI;
  char *in_RDI;
  XmlRpcValue curr_info;
  iterator c;
  scoped_lock<std::mutex> lock;
  XmlRpcValue *in_stack_fffffffffffffec8;
  int i;
  XmlRpcValue *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffee8;
  XmlRpcValue *in_stack_fffffffffffffef0;
  XmlRpcValue *in_stack_fffffffffffffef8;
  XmlRpcValue *in_stack_ffffffffffffff00;
  XmlRpcValue *in_stack_ffffffffffffff30;
  string local_88 [64];
  int local_48;
  XmlRpcValue local_38;
  shared_ptr<miniros::PublisherLink> *local_28;
  __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
  local_20 [2];
  XmlRpcValue *local_10;
  
  local_10 = in_RSI;
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_fffffffffffffed0,
             (mutex_type *)in_stack_fffffffffffffec8);
  local_20[0]._M_current =
       (shared_ptr<miniros::PublisherLink> *)
       std::
       vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
       ::begin((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                *)in_stack_fffffffffffffec8);
  while( true ) {
    local_28 = (shared_ptr<miniros::PublisherLink> *)
               std::
               vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
               ::end((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                      *)in_stack_fffffffffffffec8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                        *)in_stack_fffffffffffffed0,
                       (__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                        *)in_stack_fffffffffffffec8);
    i = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    if (!bVar1) break;
    XmlRpc::XmlRpcValue::XmlRpcValue(&local_38);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
    ::operator*(local_20);
    peVar2 = std::
             __shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4cfd9c);
    local_48 = PublisherLink::getConnectionID(peVar2);
    this_00 = XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffed0,i);
    XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff00,(int *)in_stack_fffffffffffffef8);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
    ::operator*(local_20);
    peVar2 = std::
             __shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4cfdf4);
    this_01 = PublisherLink::getPublisherXMLRPCURI_abi_cxx11_(peVar2);
    XmlRpc::XmlRpcValue::XmlRpcValue(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    rhs = XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffed0,i);
    XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)this_01,rhs);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4cfe51);
    in_stack_ffffffffffffff00 = XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffed0,i);
    XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff30,in_RDI);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
    ::operator*(local_20);
    peVar2 = std::
             __shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4cfe92);
    (*peVar2->_vptr_PublisherLink[3])(local_88);
    XmlRpc::XmlRpcValue::XmlRpcValue(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    in_stack_fffffffffffffef8 = XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffed0,i);
    XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)this_01,rhs);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4cfef9);
    std::__cxx11::string::~string(local_88);
    XmlRpc::XmlRpcValue::XmlRpcValue(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    in_stack_fffffffffffffef0 = XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffed0,i);
    XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)this_01,rhs);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4cff58);
    in_stack_fffffffffffffee8 =
         (string *)XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffed0,i);
    XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff00,(bool *)in_stack_fffffffffffffef8);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
    ::operator*(local_20);
    peVar2 = std::
             __shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4cffa2);
    (*peVar2->_vptr_PublisherLink[4])(&stack0xffffffffffffff30);
    XmlRpc::XmlRpcValue::XmlRpcValue(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffed0,i);
    XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)this_01,rhs);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4d0003);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
    in_stack_fffffffffffffed0 = local_10;
    XmlRpc::XmlRpcValue::size(this_00);
    in_stack_fffffffffffffec8 = XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffed0,i);
    XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)this_01,rhs);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4d0059);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
    ::operator++(local_20);
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4d0189);
  return;
}

Assistant:

void Subscription::getInfo(XmlRpc::XmlRpcValue& info)
{
  std::scoped_lock<std::mutex> lock(publisher_links_mutex_);

  for (V_PublisherLink::iterator c = publisher_links_.begin();
       c != publisher_links_.end(); ++c)
  {
    XmlRpcValue curr_info;
    curr_info[0] = (int)(*c)->getConnectionID();
    curr_info[1] = (*c)->getPublisherXMLRPCURI();
    curr_info[2] = "i";
    curr_info[3] = (*c)->getTransportType();
    curr_info[4] = name_;
    curr_info[5] = true; // For length compatibility with rospy
    curr_info[6] = (*c)->getTransportInfo();
    info[info.size()] = curr_info;
  }
}